

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O0

int mml_parse(uchar *buffer,int bufsize,char *ptr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  uchar *puVar6;
  int local_3c;
  uint uStack_38;
  char c;
  int size;
  uint len;
  uint value;
  uint freq;
  uint tone;
  char *ptr_local;
  uchar *puStack_18;
  int bufsize_local;
  uchar *buffer_local;
  
  local_3c = 0;
  _freq = ptr;
  ptr_local._4_4_ = bufsize;
  puStack_18 = buffer;
  while( true ) {
    pcVar5 = _freq + 1;
    cVar1 = *_freq;
    if (cVar1 == '\0') {
      return local_3c;
    }
    if (ptr_local._4_4_ < 7) break;
    switch(cVar1) {
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
      value = tone_table[cVar1 + -0x41];
      if ((*pcVar5 == '#') || (*pcVar5 == '+')) {
        value = value + 1;
        pcVar5 = _freq + 2;
      }
      else if (*pcVar5 == '-') {
        value = value - 1;
        pcVar5 = _freq + 2;
      }
      _freq = pcVar5;
      ppuVar4 = __ctype_b_loc();
      uVar2 = snd_length;
      if (((*ppuVar4)[(int)*_freq] & 0x800) != 0) {
        uVar2 = mml_get_length((char **)&freq);
      }
      uStack_38 = uVar2 * 0x100;
      if (*_freq == '.') {
        uStack_38 = uVar2 * 0xc000 >> 8;
        _freq = _freq + 1;
      }
      if (uStack_38 == 0) {
        error("Incorrect note length!");
        return -1;
      }
      uVar2 = (int)(0x36a0600 / (ulong)(uint)(freq_table[value] << ((char)snd_octave - 1U & 0x1f)))
              + 1U >> 1;
      *puStack_18 = '\x04';
      puStack_18[1] = (uchar)uVar2;
      puVar6 = puStack_18 + 3;
      puStack_18[2] = (uchar)(uVar2 >> 8);
      if (snd_wave_flag == 0) {
        if (snd_off != 0) {
          snd_off = 0;
          *puVar6 = '\x02';
          local_3c = local_3c + 1;
          puVar6 = puStack_18 + 4;
        }
      }
      else {
        snd_wave_flag = 0;
        snd_off = 0;
        *puVar6 = (char)snd_wave + '\x13';
        local_3c = local_3c + 1;
        puVar6 = puStack_18 + 4;
      }
      puStack_18 = puVar6;
      *puStack_18 = '\x05';
      puStack_18 = puStack_18 + 1;
      iVar3 = mml_calc_duration(uStack_38);
      *puStack_18 = (uchar)iVar3;
      local_3c = local_3c + 5;
      puStack_18 = puStack_18 + 1;
      break;
    default:
      _freq = pcVar5;
      error("Syntax error!");
      return -1;
    case 'L':
      _freq = pcVar5;
      snd_length = mml_get_length((char **)&freq);
      if (snd_length == 0) {
        error("Incorrect note length!");
        return -1;
      }
      break;
    case 'O':
      _freq = pcVar5;
      snd_octave = mml_get_value((char **)&freq);
      if ((snd_octave == 0) || (7 < snd_octave)) {
        error("Incorrect octave!");
        return -1;
      }
      break;
    case 'R':
      _freq = pcVar5;
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)*_freq] & 0x800) == 0) {
        uStack_38 = 0x400;
      }
      else {
        iVar3 = mml_get_length((char **)&freq);
        uStack_38 = iVar3 << 8;
      }
      if (*_freq == '.') {
        uStack_38 = uStack_38 * 0xc0 >> 8;
        _freq = _freq + 1;
      }
      if (uStack_38 == 0) {
        error("Incorrect note length!");
        return -1;
      }
      puVar6 = puStack_18 + 1;
      *puStack_18 = '\x01';
      puStack_18 = puStack_18 + 2;
      *puVar6 = '\x05';
      iVar3 = mml_calc_duration(uStack_38);
      *puStack_18 = (uchar)iVar3;
      snd_off = 1;
      local_3c = local_3c + 3;
      puStack_18 = puStack_18 + 1;
      break;
    case 'T':
      _freq = pcVar5;
      snd_tempo = mml_get_value((char **)&freq);
      if ((snd_tempo < 0x20) || (0x100 < snd_tempo)) {
        error("Incorrect tempo!");
        return -1;
      }
      break;
    case 'V':
      _freq = pcVar5;
      snd_volume = mml_get_value((char **)&freq);
      if (0xf < snd_volume) {
        error("Incorrect volume!");
        return -1;
      }
      *puStack_18 = '\x03';
      puStack_18[1] = (char)(snd_volume << 4) + (char)snd_volume;
      local_3c = local_3c + 2;
      puStack_18 = puStack_18 + 2;
      break;
    case 'W':
      _freq = pcVar5;
      snd_wave = mml_get_value((char **)&freq);
      snd_wave_flag = 1;
      if ((snd_wave == 0) || (3 < snd_wave)) {
        error("Incorrect waveform!");
        return -1;
      }
    }
    ptr_local._4_4_ = ptr_local._4_4_ - local_3c;
  }
  _freq = pcVar5;
  fatal_error("Internal error: MML buffer too small!");
  return -1;
}

Assistant:

int
mml_parse(unsigned char *buffer, int bufsize, char *ptr)
{
	unsigned int tone, freq, value, len;
	int size = 0;
	char c;

	/* parse string */
	while ((c = *ptr++) != '\0') {
		/* check buffer size */
		if (bufsize < 7) {
			fatal_error("Internal error: MML buffer too small!");
			return (-1);
		}

		switch (c) {
		/* octave */
		case 'O':
			snd_octave = mml_get_value(&ptr);
	
			if ((snd_octave < 1) || (snd_octave > 7)) {
				error("Incorrect octave!");
				return (-1);
			}
			break;
	
		/* volume */
		case 'V':
			snd_volume = mml_get_value(&ptr);
	
			if (snd_volume > 15) {
				error("Incorrect volume!");
				return (-1);
			}
	
			/* gen code */
			*buffer++ = SND_VOLUME;
			*buffer++ = (snd_volume << 4) + snd_volume;
			size += 2;
			break;

		/* tempo */
		case 'T':
			snd_tempo = mml_get_value(&ptr);
	
			if ((snd_tempo < 32) || (snd_tempo > 256)) {
				error("Incorrect tempo!");
				return (-1);
			}
			break;
	
		/* length */
		case 'L':
			snd_length = mml_get_length(&ptr);
	
			if (!snd_length) {
				error("Incorrect note length!");
				return (-1);
			}
			break;
	
		/* notes */
		case 'A':
		case 'B':
		case 'C':
		case 'D':
		case 'E':
		case 'F':
		case 'G':
			/* base */
			tone = tone_table[c - 'A'];

			/* extra commands */
			if ((*ptr == '#') || (*ptr == '+')) {
				tone++;
				ptr++;
			}
			else if (*ptr == '-') {
				tone--;
				ptr++;
			}
			if (isdigit(*ptr))
				len = (mml_get_length(&ptr) << 8);
			else {
				len = (snd_length << 8);
			}
			if (*ptr == '.') {
				len = (len * 0xC0) >> 8;
				ptr++;
			}

			/* check length */
			if (!len) {
				error("Incorrect note length!");
				return (-1);
			}

			/* calculate frequency */
			freq  = (freq_table[tone] << (snd_octave - 1));
			value = (((3580000 * 16) / freq) + 1) >> 1;

			/* gen code */
			*buffer++ = SND_FREQ;
			*buffer++ = (value)  & 0xFF;
			*buffer++ = (value >> 8) & 0xFF;

			if (snd_wave_flag) {
				/* new waveform */
				snd_wave_flag = 0;
				snd_off = 0;
			   *buffer++ = SND_WAVE_SINE + (snd_wave - 1);
				size += 1;
			}
			else {
				if (snd_off) {
					/* sound on */
					snd_off = 0;
				   *buffer++ = SND_ON;
					size += 1;
				}
			}

			*buffer++ = SND_DURATION;
			*buffer++ = mml_calc_duration(len);
			size += 5;
			break;
	
		/* rest */
		case 'R':
			/* local length */
			if (isdigit(*ptr))
				len = (mml_get_length(&ptr) << 8);
			else {
				len = (0x0400);
			}
			if (*ptr == '.') {
				len = (len * 0xC0) >> 8;
				ptr++;
			}

			/* check length */
			if (!len) {
				error("Incorrect note length!");
				return (-1);
			}

			/* gen code */
			*buffer++ = SND_OFF;
			*buffer++ = SND_DURATION;
			*buffer++ = mml_calc_duration(len);
			snd_off = 1;
			size += 3;
			break;

		/* waveform */
		case 'W':
			snd_wave = mml_get_value(&ptr);
			snd_wave_flag = 1;
	
			if ((snd_wave < 1) || (snd_wave > 3)) {
				error("Incorrect waveform!");
				return (-1);
			}
			break;
	
		/* other */
		default:
			error("Syntax error!");
			return (-1);
		}

		/* update size */
		bufsize -= size;
	}

	/* ok */
	return (size);
}